

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[7],kj::Array<unsigned_char>&>
          (String *__return_storage_ptr__,kj *this,char (*params) [7],Array<unsigned_char> *params_1
          )

{
  long lVar1;
  undefined8 uVar2;
  ArrayPtr<const_char> local_60;
  char *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  undefined8 *local_30;
  kj *local_28;
  size_t local_20;
  
  local_20 = strlen((char *)this);
  local_60.ptr = *(char **)params;
  local_60.size_ = *(size_t *)(params[1] + 1);
  local_50 = ", ";
  local_48 = 3;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = (undefined8 *)0x0;
  local_28 = this;
  _::concat<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_28,&local_60,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params_1);
  uVar2 = uStack_38;
  lVar1 = local_40;
  if (local_40 != 0) {
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)*local_30)(local_30,lVar1,0x10,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}